

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall
Encoder::TryCopyAndAddRelocRecordsForSwitchJumpTableEntries
          (Encoder *this,BYTE *codeStart,size_t codeSize,
          JmpTableList *jumpTableListForSwitchStatement,size_t totalJmpTableSizeInBytes)

{
  BYTE *ptr;
  int iVar1;
  BranchJumpTableWrapper *pBVar2;
  void **__src;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  BYTE *__dest;
  long lVar7;
  size_t __n;
  long lVar8;
  
  if (jumpTableListForSwitchStatement != (JmpTableList *)0x0) {
    __dest = codeStart + codeSize + -totalJmpTableSizeInBytes;
    if (0 < (jumpTableListForSwitchStatement->
            super_ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar8 = 0;
      do {
        pBVar2 = (jumpTableListForSwitchStatement->
                 super_ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer>
                 ).buffer[lVar8];
        if (pBVar2 == (BranchJumpTableWrapper *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x3cc,"(branchJumpTableWrapper != nullptr)",
                             "branchJumpTableWrapper != nullptr");
          if (!bVar4) goto LAB_0040a020;
          *puVar5 = 0;
        }
        __src = pBVar2->jmpTable;
        pLVar6 = pBVar2->labelInstr;
        iVar1 = pBVar2->tableSize;
        if (pLVar6 == (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x3d1,"(branchJumpTableWrapper->labelInstr != nullptr)",
                             "Label not yet created?");
          if (!bVar4) goto LAB_0040a020;
          *puVar5 = 0;
          pLVar6 = pBVar2->labelInstr;
        }
        if ((pLVar6->m_pc).pc != (BYTE *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x3d2,"(branchJumpTableWrapper->labelInstr->GetPC() == nullptr)",
                             "branchJumpTableWrapper->labelInstr->GetPC() == nullptr");
          if (!bVar4) goto LAB_0040a020;
          *puVar5 = 0;
          pLVar6 = pBVar2->labelInstr;
        }
        __n = (long)iVar1 * 8;
        (pLVar6->m_pc).pc = __dest;
        memcpy(__dest,__src,__n);
        if (0 < pBVar2->tableSize) {
          lVar7 = 0;
          do {
            if ((long)__n <= lVar7 * 8) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                                 ,0x3da,
                                 "((ptrdiff_t) addressOfJmpTableEntry - (ptrdiff_t) jmpTableStartAddress < (ptrdiff_t) jmpTableSizeInBytes)"
                                 ,
                                 "(ptrdiff_t) addressOfJmpTableEntry - (ptrdiff_t) jmpTableStartAddress < (ptrdiff_t) jmpTableSizeInBytes"
                                );
              if (!bVar4) goto LAB_0040a020;
              *puVar5 = 0;
            }
            ptr = __dest + lVar7 * 8;
            EncoderMD::AppendRelocEntry
                      (&this->m_encoderMD,RelocTypeLabelUse,ptr,*(LabelInstr **)ptr);
            ptr[0] = '\0';
            ptr[1] = '\0';
            ptr[2] = '\0';
            ptr[3] = '\0';
            ptr[4] = '\0';
            ptr[5] = '\0';
            ptr[6] = '\0';
            ptr[7] = '\0';
            lVar7 = lVar7 + 1;
          } while (lVar7 < pBVar2->tableSize);
        }
        __dest = __dest + __n;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (jumpTableListForSwitchStatement->
                       super_ReadOnlyList<BranchJumpTableWrapper_*,_Memory::ArenaAllocator,_DefaultComparer>
                       ).count);
    }
    if (__dest != codeStart + codeSize) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x3e6,"(jmpTableStartAddress == codeStart + codeSize)",
                         "jmpTableStartAddress == codeStart + codeSize");
      if (!bVar4) {
LAB_0040a020:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void Encoder::TryCopyAndAddRelocRecordsForSwitchJumpTableEntries(BYTE *codeStart, size_t codeSize, JmpTableList * jumpTableListForSwitchStatement, size_t totalJmpTableSizeInBytes)
{
    if (jumpTableListForSwitchStatement == nullptr)
    {
        return;
    }

    BYTE * jmpTableStartAddress = codeStart + codeSize - totalJmpTableSizeInBytes;
    EncoderMD * encoderMD = &m_encoderMD;

    jumpTableListForSwitchStatement->Map([&](uint index, BranchJumpTableWrapper * branchJumpTableWrapper) -> void
    {
        Assert(branchJumpTableWrapper != nullptr);

        void ** srcJmpTable = branchJumpTableWrapper->jmpTable;
        size_t jmpTableSizeInBytes = branchJumpTableWrapper->tableSize * sizeof(void*);

        AssertMsg(branchJumpTableWrapper->labelInstr != nullptr, "Label not yet created?");
        Assert(branchJumpTableWrapper->labelInstr->GetPC() == nullptr);

        branchJumpTableWrapper->labelInstr->SetPC(jmpTableStartAddress);
        memcpy(jmpTableStartAddress, srcJmpTable, jmpTableSizeInBytes);

        for (int i = 0; i < branchJumpTableWrapper->tableSize; i++)
        {
            void * addressOfJmpTableEntry = jmpTableStartAddress + (i * sizeof(void*));
            Assert((ptrdiff_t) addressOfJmpTableEntry - (ptrdiff_t) jmpTableStartAddress < (ptrdiff_t) jmpTableSizeInBytes);
#if defined(_M_ARM32_OR_ARM64)
            encoderMD->AddLabelReloc((byte*) addressOfJmpTableEntry);
#else
            encoderMD->AppendRelocEntry(RelocTypeLabelUse, addressOfJmpTableEntry, *(IR::LabelInstr**)addressOfJmpTableEntry);
            *((size_t*)addressOfJmpTableEntry) = 0;
#endif
        }

        jmpTableStartAddress += (jmpTableSizeInBytes);
    });

    Assert(jmpTableStartAddress == codeStart + codeSize);
}